

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcsample.c
# Opt level: O2

void h2v1_downsample(j_compress_ptr cinfo,jpeg_component_info *compptr,JSAMPARRAY input_data,
                    JSAMPARRAY output_data)

{
  JSAMPROW pJVar1;
  JSAMPROW pJVar2;
  long lVar3;
  long lVar4;
  uint uVar5;
  int iVar6;
  
  iVar6 = compptr->DCT_h_scaled_size * compptr->width_in_blocks;
  expand_right_edge(input_data,cinfo->max_v_samp_factor,cinfo->image_width,iVar6 * 2);
  for (lVar3 = 0; lVar3 < cinfo->max_v_samp_factor; lVar3 = lVar3 + 1) {
    pJVar1 = output_data[lVar3];
    pJVar2 = input_data[lVar3];
    uVar5 = 0;
    for (lVar4 = 0; iVar6 != (int)lVar4; lVar4 = lVar4 + 1) {
      pJVar1[lVar4] = (JSAMPLE)(pJVar2[lVar4 * 2] + uVar5 + (uint)pJVar2[lVar4 * 2 + 1] >> 1);
      uVar5 = uVar5 ^ 1;
    }
  }
  return;
}

Assistant:

METHODDEF(void)
h2v1_downsample (j_compress_ptr cinfo, jpeg_component_info * compptr,
		 JSAMPARRAY input_data, JSAMPARRAY output_data)
{
  int inrow;
  JDIMENSION outcol;
  JDIMENSION output_cols = compptr->width_in_blocks * compptr->DCT_h_scaled_size;
  register JSAMPROW inptr, outptr;
  register int bias;

  /* Expand input data enough to let all the output samples be generated
   * by the standard loop.  Special-casing padded output would be more
   * efficient.
   */
  expand_right_edge(input_data, cinfo->max_v_samp_factor,
		    cinfo->image_width, output_cols * 2);

  for (inrow = 0; inrow < cinfo->max_v_samp_factor; inrow++) {
    outptr = output_data[inrow];
    inptr = input_data[inrow];
    bias = 0;			/* bias = 0,1,0,1,... for successive samples */
    for (outcol = 0; outcol < output_cols; outcol++) {
      *outptr++ = (JSAMPLE) ((GETJSAMPLE(*inptr) + GETJSAMPLE(inptr[1])
			      + bias) >> 1);
      bias ^= 1;		/* 0=>1, 1=>0 */
      inptr += 2;
    }
  }
}